

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfAttribute.h
# Opt level: O0

void __thiscall
Imf_3_4::TypedAttribute<Imath_3_2::Matrix44<double>_>::TypedAttribute
          (TypedAttribute<Imath_3_2::Matrix44<double>_> *this,Matrix44<double> *value)

{
  Matrix44<double> *in_RSI;
  Attribute *in_RDI;
  
  Attribute::Attribute(in_RDI);
  in_RDI->_vptr_Attribute = (_func_int **)&PTR__TypedAttribute_002ac970;
  Imath_3_2::Matrix44<double>::Matrix44((Matrix44<double> *)(in_RDI + 1),in_RSI);
  return;
}

Assistant:

TypedAttribute<T>::TypedAttribute (const T& value)
    : Attribute (), _value (value)
{
    // empty
}